

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O2

void __thiscall Assimp::Collada::Animation::~Animation(Animation *this)

{
  Animation *this_00;
  pointer ppAVar1;
  
  for (ppAVar1 = (this->mSubAnims).
                 super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppAVar1 !=
      (this->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppAVar1 = ppAVar1 + 1) {
    this_00 = *ppAVar1;
    if (this_00 != (Animation *)0x0) {
      ~Animation(this_00);
    }
    operator_delete(this_00,0x50);
  }
  std::_Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>::
  ~_Vector_base(&(this->mSubAnims).
                 super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
               );
  std::vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
  ::~vector(&this->mChannels);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Animation()
    {
        for( std::vector<Animation*>::iterator it = mSubAnims.begin(); it != mSubAnims.end(); ++it)
            delete *it;
    }